

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O0

uint64_t __thiscall slang::ConstantValue::getBitstreamWidth(ConstantValue *this)

{
  bool bVar1;
  bitwidth_t bVar2;
  SVInt *this_00;
  string *this_01;
  size_type sVar3;
  uint64_t uVar4;
  _Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>
  *in_RDI;
  ConstantValue *cv_1;
  const_iterator __end4;
  const_iterator __begin4;
  SVQueue *__range4;
  pair<const_slang::ConstantValue,_slang::ConstantValue> *kv;
  const_iterator __end3;
  const_iterator __begin3;
  AssociativeArray *__range3;
  ConstantValue *cv;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ConstantValue,_18446744073709551615UL> *__range2;
  uint64_t width;
  span<const_slang::ConstantValue,_18446744073709551615UL> *in_stack_ffffffffffffff38;
  span<const_slang::ConstantValue,_18446744073709551615UL> *in_stack_ffffffffffffff48;
  _Self local_b0;
  _Self local_90;
  SVQueue *local_70;
  reference local_68;
  _Self local_60;
  _Self local_58;
  AssociativeArray *local_50;
  reference local_48;
  ConstantValue *local_40;
  __normal_iterator<const_slang::ConstantValue_*,_std::span<const_slang::ConstantValue,_18446744073709551615UL>_>
  local_38;
  span<const_slang::ConstantValue,_18446744073709551615UL> local_30;
  span<const_slang::ConstantValue,_18446744073709551615UL> *local_20;
  ConstantValue *local_8;
  
  bVar1 = isInteger((ConstantValue *)0x335e11);
  if (bVar1) {
    this_00 = integer((ConstantValue *)0x335e21);
    bVar2 = SVInt::getBitWidth(this_00);
    local_8 = (ConstantValue *)(ulong)bVar2;
  }
  else {
    bVar1 = isString((ConstantValue *)0x335e42);
    if (bVar1) {
      this_01 = str_abi_cxx11_((ConstantValue *)0x335e52);
      sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              length(this_01);
      local_8 = (ConstantValue *)(sVar3 << 3);
    }
    else {
      local_8 = (ConstantValue *)0x0;
      bVar1 = isUnpacked((ConstantValue *)0x335e81);
      if (bVar1) {
        local_30 = elements((ConstantValue *)0x335e94);
        local_20 = &local_30;
        local_38._M_current =
             (ConstantValue *)
             std::span<const_slang::ConstantValue,_18446744073709551615UL>::begin
                       (in_stack_ffffffffffffff38);
        local_40 = (ConstantValue *)
                   std::span<const_slang::ConstantValue,_18446744073709551615UL>::end
                             (in_stack_ffffffffffffff48);
        while (bVar1 = __gnu_cxx::
                       operator==<const_slang::ConstantValue_*,_std::span<const_slang::ConstantValue,_18446744073709551615UL>_>
                                 ((__normal_iterator<const_slang::ConstantValue_*,_std::span<const_slang::ConstantValue,_18446744073709551615UL>_>
                                   *)in_RDI,
                                  (__normal_iterator<const_slang::ConstantValue_*,_std::span<const_slang::ConstantValue,_18446744073709551615UL>_>
                                   *)in_stack_ffffffffffffff38), ((bVar1 ^ 0xffU) & 1) != 0) {
          local_48 = __gnu_cxx::
                     __normal_iterator<const_slang::ConstantValue_*,_std::span<const_slang::ConstantValue,_18446744073709551615UL>_>
                     ::operator*(&local_38);
          uVar4 = getBitstreamWidth(local_8);
          local_8 = (ConstantValue *)
                    ((long)&(local_8->value).
                            super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    + uVar4);
          __gnu_cxx::
          __normal_iterator<const_slang::ConstantValue_*,_std::span<const_slang::ConstantValue,_18446744073709551615UL>_>
          ::operator++(&local_38);
        }
      }
      else {
        bVar1 = isMap((ConstantValue *)0x335f4b);
        if (bVar1) {
          map((ConstantValue *)0x335f5e);
          local_50 = CopyPtr<slang::AssociativeArray>::operator*
                               ((CopyPtr<slang::AssociativeArray> *)0x335f66);
          local_58._M_node =
               (_Base_ptr)
               std::
               map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
               ::begin((map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                        *)in_stack_ffffffffffffff38);
          local_60._M_node =
               (_Base_ptr)
               std::
               map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
               ::end((map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                      *)in_stack_ffffffffffffff38);
          while (bVar1 = std::operator==(&local_58,&local_60), ((bVar1 ^ 0xffU) & 1) != 0) {
            local_68 = std::
                       _Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>
                       ::operator*((_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>
                                    *)in_RDI);
            uVar4 = getBitstreamWidth(local_8);
            local_8 = (ConstantValue *)
                      ((long)&(local_8->value).
                              super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                              .
                              super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                              .
                              super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                              .
                              super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                              .
                              super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                              .
                              super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      + uVar4);
            std::
            _Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>::
            operator++((_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>
                        *)in_RDI);
          }
        }
        else {
          bVar1 = isQueue((ConstantValue *)0x335fe8);
          if (bVar1) {
            queue((ConstantValue *)0x335ffb);
            local_70 = CopyPtr<slang::SVQueue>::operator*((CopyPtr<slang::SVQueue> *)0x336003);
            std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::begin
                      ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                       in_stack_ffffffffffffff38);
            std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::end
                      ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                       in_stack_ffffffffffffff38);
            while (bVar1 = std::operator==(&local_90,&local_b0), ((bVar1 ^ 0xffU) & 1) != 0) {
              std::
              _Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>
              ::operator*(&local_90);
              uVar4 = getBitstreamWidth(local_8);
              local_8 = (ConstantValue *)
                        ((long)&(local_8->value).
                                super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                .
                                super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                .
                                super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                .
                                super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                .
                                super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                .
                                super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        + uVar4);
              std::
              _Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>
              ::operator++(in_RDI);
            }
          }
          else {
            bVar1 = isUnion((ConstantValue *)0x33607e);
            if (bVar1) {
              unionVal((ConstantValue *)0x33608e);
              CopyPtr<slang::SVUnion>::operator->((CopyPtr<slang::SVUnion> *)0x336096);
              local_8 = (ConstantValue *)getBitstreamWidth(local_8);
            }
          }
        }
      }
    }
  }
  return (uint64_t)local_8;
}

Assistant:

uint64_t ConstantValue::getBitstreamWidth() const {
    // Note that we don't have to worry about overflow in this
    // method because we have an artificial limit on how
    // large constant values are allowed to be.
    // TODO: actually implement the mentioned limit
    if (isInteger())
        return integer().getBitWidth();

    if (isString())
        return str().length() * CHAR_BIT;

    uint64_t width = 0;
    if (isUnpacked()) {
        for (const auto& cv : elements())
            width += cv.getBitstreamWidth();
    }
    else if (isMap()) {
        for (const auto& kv : *map())
            width += kv.second.getBitstreamWidth();
    }
    else if (isQueue()) {
        for (const auto& cv : *queue())
            width += cv.getBitstreamWidth();
    }
    else if (isUnion()) {
        width = unionVal()->value.getBitstreamWidth();
    }

    return width;
}